

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void f_parser(lua_State *L,void *ud)

{
  size_t sVar1;
  ZIO *z;
  byte *pbVar2;
  uint firstchar;
  char *pcVar3;
  LClosure *cl;
  char *mode;
  
  mode = "bt";
  if (*(char **)((long)ud + 0x50) != (char *)0x0) {
    mode = *(char **)((long)ud + 0x50);
  }
  z = *ud;
  sVar1 = z->n;
  z->n = z->n - 1;
  if (sVar1 == 0) {
    firstchar = luaZ_fill(z);
  }
  else {
    pbVar2 = (byte *)z->p;
    z->p = (char *)(pbVar2 + 1);
    firstchar = (uint)*pbVar2;
  }
  if (firstchar == 0x1b) {
    pcVar3 = strchr(mode,0x42);
    if (pcVar3 == (char *)0x0) {
      checkmode(L,mode,"binary");
    }
    cl = luaU_undump(L,*ud,*(char **)((long)ud + 0x58),(uint)(pcVar3 != (char *)0x0));
  }
  else {
    checkmode(L,mode,"text");
    cl = luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),(Dyndata *)((long)ud + 0x20),
                     *(char **)((long)ud + 0x58),firstchar);
  }
  luaF_initupvals(L,cl);
  return;
}

Assistant:

static void f_parser (lua_State *L, void *ud) {
  LClosure *cl;
  struct SParser *p = cast(struct SParser *, ud);
  const char *mode = p->mode ? p->mode : "bt";
  int c = zgetc(p->z);  /* read first character */
  if (c == LUA_SIGNATURE[0]) {
    int fixed = 0;
    if (strchr(mode, 'B') != NULL)
      fixed = 1;
    else
      checkmode(L, mode, "binary");
    cl = luaU_undump(L, p->z, p->name, fixed);
  }
  else {
    checkmode(L, mode, "text");
    cl = luaY_parser(L, p->z, &p->buff, &p->dyd, p->name, c);
  }
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luaF_initupvals(L, cl);
}